

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_fsp.cpp
# Opt level: O0

size_t __thiscall ON_FixedSizePool::BlockElementCapacity(ON_FixedSizePool *this,void *block)

{
  char *block_head;
  char *block_end;
  void *block_local;
  ON_FixedSizePool *this_local;
  
  if ((block == (void *)0x0) || (this->m_sizeof_element == 0)) {
    this_local = (ON_FixedSizePool *)0x0;
  }
  else {
    this_local = (ON_FixedSizePool *)
                 ((ulong)(*(long *)((long)block + 8) - ((long)block + 0x10)) /
                 this->m_sizeof_element);
  }
  return (size_t)this_local;
}

Assistant:

size_t ON_FixedSizePool::BlockElementCapacity( const void* block ) const
{
  // returns number of items that can be allocated from block
  if ( 0 == block || m_sizeof_element <= 0 )
    return 0;

  const char* block_end = *((const char**)(((const char*)block)+sizeof(void*)));
  const char* block_head = (((const char*)block) + 2*sizeof(void*));
  return (block_end - block_head)/m_sizeof_element;
}